

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::iterate(TextureCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  short sVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 err;
  void *__s;
  void *__s_00;
  void *__s_01;
  short *psVar7;
  undefined4 extraout_var;
  short sVar8;
  int x;
  char *description;
  long lVar9;
  qpTestResult testResult;
  short *psVar10;
  short sVar11;
  short sVar12;
  int y;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float posX;
  Surface resultImage;
  Surface local_1d0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [384];
  
  __s = operator_new(0x1000);
  memset(__s,0,0x1000);
  __s_00 = operator_new(0x800);
  memset(__s_00,0,0x800);
  __s_01 = operator_new(0xa8c);
  memset(__s_01,0,0xa8c);
  tcu::Surface::Surface(&local_1d0,0x100,0x100);
  lVar16 = (long)__s + 0xc;
  lVar15 = (long)__s_00 + 4;
  lVar14 = 0;
  do {
    fVar20 = (float)(int)lVar14 / 15.0;
    lVar13 = 0;
    lVar9 = lVar16;
    do {
      fVar17 = (float)(int)lVar13 / 15.0;
      fVar18 = exp2f((float)(int)lVar14 + -8.0);
      fVar19 = exp2f((float)(int)lVar13 + -8.0);
      *(float *)(lVar9 + -0xc) = fVar20 + fVar20 + -1.0;
      *(float *)(lVar9 + -8) = fVar17 + fVar17 + -1.0;
      *(undefined8 *)(lVar9 + -4) = 0x3f80000000000000;
      *(float *)(lVar15 + -4 + lVar13 * 8) = fVar18;
      *(float *)(lVar15 + lVar13 * 8) = fVar19;
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar13 != 0x10);
    lVar14 = lVar14 + 1;
    lVar16 = lVar16 + 0x100;
    lVar15 = lVar15 + 0x80;
  } while (lVar14 != 0x10);
  psVar7 = (short *)((long)__s_01 + 10);
  sVar8 = 0;
  lVar14 = 0;
  do {
    lVar15 = -0xf;
    psVar10 = psVar7;
    do {
      sVar1 = (short)lVar15;
      sVar11 = sVar8 + sVar1 + 0xf;
      psVar10[-5] = sVar11;
      sVar12 = sVar8 + 0x20 + sVar1;
      psVar10[-4] = sVar12;
      psVar10[-3] = sVar8 + 0x1f + sVar1;
      psVar10[-2] = sVar11;
      psVar10[-1] = sVar12;
      *psVar10 = sVar8 + sVar1 + 0x10;
      psVar10 = psVar10 + 6;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
    lVar14 = lVar14 + 1;
    psVar7 = psVar7 + 0x5a;
    sVar8 = sVar8 + 0x10;
  } while (lVar14 != 0xf);
  local_1b0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Drawing a textured grid with the shader.",0x28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar14 = CONCAT44(extraout_var,iVar3);
  uVar4 = (**(code **)(lVar14 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar5 = (**(code **)(lVar14 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  uVar6 = (**(code **)(lVar14 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_sampler");
  (**(code **)(lVar14 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar14 + 0x188))(0x4000);
  (**(code **)(lVar14 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar14 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar14 + 0x14f0))(uVar6,0);
  (**(code **)(lVar14 + 0xb8))(0xde1,this->m_textureID);
  (**(code **)(lVar14 + 0x19f0))(uVar4,4,0x1406,0,0,__s);
  (**(code **)(lVar14 + 0x19f0))(uVar5,2,0x1406,0,0,__s_00);
  (**(code **)(lVar14 + 0x610))(uVar4);
  (**(code **)(lVar14 + 0x610))(uVar5);
  (**(code **)(lVar14 + 0x568))(4,0x546,0x1403,__s_01);
  (**(code **)(lVar14 + 0x518))(uVar4);
  (**(code **)(lVar14 + 0x518))(uVar5);
  (**(code **)(lVar14 + 0x1680))(0);
  (**(code **)(lVar14 + 0x648))();
  err = (**(code **)(lVar14 + 0x800))();
  glu::checkError(err,"TextureCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x4cc);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1d0.m_pixels.m_cap != (void *)0x0) {
    local_1d0.m_pixels.m_cap = (size_t)local_1d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1d0.m_width,local_1d0.m_height,1,
             (void *)local_1d0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar2 = RenderCase::checkResultImage(&this->super_RenderCase,&local_1d0);
  if (bVar2) {
    bVar2 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    testResult = (qpTestResult)!bVar2;
    description = "test pattern failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&local_1d0);
  operator_delete(__s_01,0xa8c);
  operator_delete(__s_00,0x800);
  operator_delete(__s,0x1000);
  return STOP;
}

Assistant:

TextureCase::IterateResult TextureCase::iterate (void)
{
	// Draw a grid and texture it with a floating point texture containing special values. If all goes well, nothing special should happen

	const int				gridSize		= 16;
	std::vector<tcu::Vec4>	gridVertices	(gridSize * gridSize);
	std::vector<tcu::Vec2>	gridTexCoords	(gridSize * gridSize);
	std::vector<deUint16>	indices			((gridSize - 1) * (gridSize - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < gridSize; ++x)
	for (int y = 0; y < gridSize; ++y)
	{
		const float posX		= (float)x / ((float)gridSize - 1.0f) * 2.0f - 1.0f; // map from [0, gridSize - 1] to [-1, 1]
		const float posY		= (float)y / ((float)gridSize - 1.0f) * 2.0f - 1.0f;
		const float texCoordX	= deFloatPow(2.0f, (float)x - (float)gridSize / 2.0f);
		const float texCoordY	= deFloatPow(2.0f, (float)y - (float)gridSize / 2.0f);

		gridVertices[x * gridSize + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * gridSize + y]	= tcu::Vec2(texCoordX, texCoordY);
	}

	// tiles
	for (int x = 0; x < gridSize - 1; ++x)
	for (int y = 0; y < gridSize - 1; ++y)
	{
		const int baseNdx = (x * (gridSize - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * gridSize + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * gridSize + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * gridSize + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * gridSize + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}